

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O3

bool BicTest3<Blob<88>,unsigned_int>(pfHash hash,int reps,bool verbose)

{
  int *piVar1;
  void *pvVar2;
  void *__s;
  long lVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined8 in_XMM7_Qb;
  uint h2;
  uint h1;
  Blob<88> key;
  uint local_90;
  uint local_8c;
  uint local_78;
  uint local_74;
  void *local_70;
  ulong local_68;
  ulong local_60;
  Rand local_58;
  undefined7 local_40;
  undefined4 uStack_39;
  
  local_40 = 0;
  uStack_39 = 0;
  local_58.x = 0x88e23b73;
  local_58.y = 0x11310f6c;
  local_58.z = 0x18847f4;
  local_58.w = 0x1142a2ba;
  __s = operator_new(0x160000);
  uVar10 = 0;
  memset(__s,0,0x160000);
  lVar13 = (long)__s + 0x10;
  do {
    if ((uVar10 & 7) == 0) {
      putchar(0x2e);
    }
    if (0 < reps) {
      iVar12 = 0;
      do {
        Rand::rand_p(&local_58,&local_40,0xb);
        (*hash)(&local_40,0xb,0,&local_74);
        flipbit(&local_40,0xb,(uint32_t)uVar10);
        (*hash)(&local_40,0xb,0,&local_78);
        lVar3 = -0x1f;
        lVar6 = 0;
        lVar4 = lVar13;
        do {
          uVar5 = (uint)lVar6;
          lVar6 = lVar6 + 1;
          lVar7 = lVar3;
          lVar8 = lVar4;
          do {
            piVar1 = (int *)(lVar8 + (ulong)(((local_78 ^ local_74) >> (uVar5 & 0x1f) & 1) +
                                            ((local_78 ^ local_74) >> ((uint)lVar7 & 0x1f) & 1) * 2)
                                     * 4);
            *piVar1 = *piVar1 + 1;
            lVar8 = lVar8 + 0x10;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0);
          lVar4 = lVar4 + 0x210;
          lVar3 = lVar3 + 1;
        } while (lVar6 != 0x1f);
        iVar12 = iVar12 + 1;
      } while (iVar12 != reps);
    }
    uVar10 = uVar10 + 1;
    lVar13 = lVar13 + 0x4000;
  } while (uVar10 != 0x58);
  putchar(10);
  auVar20 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar21 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar22 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar14 = 1;
  uVar11 = 0;
  local_90 = 0;
  local_8c = 0;
  auVar16 = ZEXT864(0) << 0x40;
  uVar10 = 0;
  local_70 = __s;
LAB_0011be24:
  local_68 = uVar10 + 1;
  local_60 = uVar14;
LAB_0011be32:
  if (verbose) {
    printf("(%3d,%3d) - ",uVar10 & 0xffffffff,uVar14 & 0xffffffff);
    auVar22 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar21 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar20 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar16 = ZEXT864(auVar16._0_8_);
  }
  pvVar2 = local_70;
  uVar9 = 0;
LAB_0011be81:
  do {
    auVar19 = ZEXT864(0) << 0x40;
    lVar13 = 0;
    do {
      lVar4 = lVar13 * 4;
      lVar13 = lVar13 + 1;
      auVar17._0_8_ =
           (double)*(int *)((long)pvVar2 + lVar4 + uVar9 * 0x4000 + uVar14 * 0x10) /
           (double)(reps / 2);
      auVar17._8_8_ = in_XMM7_Qb;
      auVar17 = vfmadd213sd_fma(auVar17,auVar20._0_16_,auVar21._0_16_);
      auVar17 = vandpd_avx(auVar17,auVar22._0_16_);
      auVar17 = vmaxsd_avx(auVar17,auVar19._0_16_);
      auVar19 = ZEXT1664(auVar17);
    } while (lVar13 != 4);
    dVar18 = auVar17._0_8_;
    if (auVar16._0_8_ < dVar18) {
      uVar11 = uVar9 & 0xffffffff;
      auVar16 = ZEXT1664(auVar17);
      local_90 = (uint)uVar10;
      local_8c = (uint)uVar14;
    }
    if (!verbose) goto LAB_0011bf42;
    iVar12 = 0x2e;
    uVar15 = auVar16._0_8_;
    if ((0.01 <= dVar18) && (iVar12 = 0x6f, 0.05 <= dVar18)) {
      iVar12 = (uint)(0.33 <= dVar18) * 9 + 0x4f;
    }
    putchar(iVar12);
    auVar16 = ZEXT864(uVar15);
    auVar20 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar21 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar22 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x58);
  if (verbose) {
    putchar(10);
    auVar22 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar21 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar20 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar16 = ZEXT864(uVar15);
    uVar14 = uVar14 + 1;
    if (uVar14 == 0x20) {
      iVar12 = 100;
      do {
        putchar(0x2d);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      putchar(10);
      auVar16 = ZEXT864(uVar15);
      auVar20 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar21 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar22 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      goto LAB_0011bfe1;
    }
    goto LAB_0011be32;
  }
  goto LAB_0011bf92;
LAB_0011bf42:
  uVar9 = uVar9 + 1;
  if (uVar9 == 0x58) goto LAB_0011bf92;
  goto LAB_0011be81;
LAB_0011bf92:
  uVar14 = uVar14 + 1;
  if (uVar14 == 0x20) goto LAB_0011bfe1;
  goto LAB_0011be32;
LAB_0011bfe1:
  local_70 = (void *)((long)local_70 + 0x200);
  uVar14 = local_60 + 1;
  uVar10 = local_68;
  if (local_68 == 0x1f) {
    printf("Max bias %f - (%3d : %3d,%3d)\n",uVar11,(ulong)local_90,(ulong)local_8c);
    operator_delete(__s);
    return auVar16._0_8_ < 0.05;
  }
  goto LAB_0011be24;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}